

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O3

Vec_Ptr_t * Bac_NtkTransformToPtr(Bac_Ntk_t *p)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  char *pcVar3;
  Vec_Ptr_t *pVVar4;
  void *pvVar5;
  
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 5;
  ppvVar2 = (void **)malloc(0x28);
  pVVar1->pArray = ppvVar2;
  pcVar3 = Abc_NamStr(p->pDesign->pStrs,p->NameId);
  *ppvVar2 = pcVar3;
  pVVar4 = Bac_NtkTransformToPtrInputs(p);
  ppvVar2[1] = pVVar4;
  pVVar4 = Bac_NtkTransformToPtrOutputs(p);
  ppvVar2[2] = pVVar4;
  pvVar5 = calloc(1,0x10);
  ppvVar2[3] = pvVar5;
  pVVar4 = Bac_NtkTransformToPtrBoxes(p);
  pVVar1->nSize = 5;
  ppvVar2[4] = pVVar4;
  return pVVar1;
}

Assistant:

Vec_Ptr_t * Bac_NtkTransformToPtr( Bac_Ntk_t * p )
{
    Vec_Ptr_t * vNtk = Vec_PtrAllocExact(5);
    Vec_PtrPush( vNtk, Bac_NtkName(p) );
    Vec_PtrPush( vNtk, Bac_NtkTransformToPtrInputs(p) );
    Vec_PtrPush( vNtk, Bac_NtkTransformToPtrOutputs(p) );
    Vec_PtrPush( vNtk, Vec_PtrAllocExact(0) );
    Vec_PtrPush( vNtk, Bac_NtkTransformToPtrBoxes(p) );
    assert( Ptr_CheckArray(vNtk) );
    return vNtk;
}